

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

ParseInfoTree * __thiscall
google::protobuf::TextFormat::ParseInfoTree::CreateNested
          (ParseInfoTree *this,FieldDescriptor *field)

{
  iterator __position;
  ParseInfoTree *pPVar1;
  _Rb_tree_header *p_Var2;
  vector<google::protobuf::TextFormat::ParseInfoTree*,std::allocator<google::protobuf::TextFormat::ParseInfoTree*>>
  *this_00;
  ParseInfoTree *instance;
  ParseInfoTree *local_28;
  FieldDescriptor *local_20;
  
  local_20 = field;
  pPVar1 = (ParseInfoTree *)operator_new(0x60);
  p_Var2 = &(pPVar1->locations_)._M_t._M_impl.super__Rb_tree_header;
  (pPVar1->locations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pPVar1->locations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pPVar1->locations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pPVar1->locations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pPVar1->locations_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(pPVar1->nested_)._M_t._M_impl.super__Rb_tree_header;
  (pPVar1->nested_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pPVar1->nested_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pPVar1->nested_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pPVar1->nested_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pPVar1->nested_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_28 = pPVar1;
  this_00 = (vector<google::protobuf::TextFormat::ParseInfoTree*,std::allocator<google::protobuf::TextFormat::ParseInfoTree*>>
             *)std::
               map<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>_>_>_>
               ::operator[](&this->nested_,&local_20);
  __position._M_current = *(ParseInfoTree ***)(this_00 + 8);
  if (__position._M_current == *(ParseInfoTree ***)(this_00 + 0x10)) {
    std::
    vector<google::protobuf::TextFormat::ParseInfoTree*,std::allocator<google::protobuf::TextFormat::ParseInfoTree*>>
    ::_M_realloc_insert<google::protobuf::TextFormat::ParseInfoTree*const&>
              (this_00,__position,&local_28);
  }
  else {
    *__position._M_current = pPVar1;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
    local_28 = pPVar1;
  }
  return local_28;
}

Assistant:

TextFormat::ParseInfoTree* TextFormat::ParseInfoTree::CreateNested(
    const FieldDescriptor* field) {
  // Owned by us in the map.
  TextFormat::ParseInfoTree* instance = new TextFormat::ParseInfoTree();
  vector<TextFormat::ParseInfoTree*>* trees = &nested_[field];
  GOOGLE_CHECK(trees);
  trees->push_back(instance);
  return instance;
}